

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

int glfwGetPhysicalDevicePresentationSupport
              (VkInstance instance,VkPhysicalDevice device,uint32_t queuefamily)

{
  GLFWbool GVar1;
  uint32_t queuefamily_local;
  VkPhysicalDevice device_local;
  VkInstance instance_local;
  
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    instance_local._4_4_ = 0;
  }
  else {
    GVar1 = _glfwInitVulkan();
    if (GVar1 == 0) {
      _glfwInputError(0x10006,"Vulkan: API not available");
      instance_local._4_4_ = 0;
    }
    else if (_glfw.vk.extensions == (char **)0x0) {
      _glfwInputError(0x10006,"Vulkan: Window surface creation extensions not found");
      instance_local._4_4_ = 0;
    }
    else {
      instance_local._4_4_ =
           _glfwPlatformGetPhysicalDevicePresentationSupport(instance,device,queuefamily);
    }
  }
  return instance_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetPhysicalDevicePresentationSupport(VkInstance instance,
                                                     VkPhysicalDevice device,
                                                     uint32_t queuefamily)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!_glfwInitVulkan())
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "Vulkan: API not available");
        return GLFW_FALSE;
    }

    if (!_glfw.vk.extensions)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return GLFW_FALSE;
    }

    return _glfwPlatformGetPhysicalDevicePresentationSupport(instance,
                                                             device,
                                                             queuefamily);
}